

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O3

int mbedtls_asn1_write_oid(uchar **p,uchar *start,char *oid,size_t oid_len)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  puVar1 = *p;
  uVar4 = 0xffffff94;
  if (oid_len <= (ulong)((long)puVar1 - (long)start) && start <= puVar1) {
    *p = puVar1 + -oid_len;
    memcpy(puVar1 + -oid_len,oid,oid_len);
    uVar3 = (uint)oid_len;
    uVar4 = uVar3;
    if (((-1 < (int)uVar3) &&
        (uVar2 = mbedtls_asn1_write_len(p,start,(ulong)(uVar3 & 0x7fffffff)), uVar4 = uVar2,
        -1 < (int)uVar2)) &&
       (puVar1 = *p, uVar4 = 0xffffff94, puVar1 != start && -1 < (long)puVar1 - (long)start)) {
      *p = puVar1 + -1;
      puVar1[-1] = '\x06';
      uVar4 = uVar3 + uVar2 + 1;
    }
  }
  return uVar4;
}

Assistant:

int mbedtls_asn1_write_oid( unsigned char **p, unsigned char *start,
                    const char *oid, size_t oid_len )
{
    int ret;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_raw_buffer( p, start,
                                  (const unsigned char *) oid, oid_len ) );
    MBEDTLS_ASN1_CHK_ADD( len , mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len , mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_OID ) );

    return( (int) len );
}